

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O2

int ARGBSepia(uint8_t *dst_argb,int dst_stride_argb,int dst_x,int dst_y,int width,int height)

{
  int iVar1;
  code *pcVar2;
  int iVar3;
  code *pcVar4;
  uint8_t *puVar5;
  int iVar6;
  bool bVar7;
  
  iVar6 = -1;
  iVar3 = -1;
  if ((((-1 < (dst_y | dst_x)) && (iVar3 = iVar6, dst_argb != (uint8_t *)0x0)) && (0 < width)) &&
     (0 < height)) {
    bVar7 = width * 4 != dst_stride_argb;
    iVar6 = 0;
    if (bVar7) {
      iVar6 = dst_stride_argb;
    }
    iVar3 = 1;
    if (!bVar7) {
      iVar3 = height;
    }
    if (!bVar7) {
      height = 1;
    }
    iVar1 = libyuv::TestCpuFlag(0x40);
    pcVar2 = ARGBSepiaRow_C;
    if ((iVar3 * width & 7U) == 0) {
      pcVar2 = ARGBSepiaRow_SSSE3;
    }
    puVar5 = dst_argb + (long)(dst_y * dst_stride_argb) + (long)(dst_x << 2);
    pcVar4 = ARGBSepiaRow_C;
    if (iVar1 != 0) {
      pcVar4 = pcVar2;
    }
    while (bVar7 = height != 0, height = height + -1, bVar7) {
      (*pcVar4)(puVar5,iVar3 * width);
      puVar5 = puVar5 + iVar6;
    }
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

LIBYUV_API
int ARGBSepia(uint8_t* dst_argb,
              int dst_stride_argb,
              int dst_x,
              int dst_y,
              int width,
              int height) {
  int y;
  void (*ARGBSepiaRow)(uint8_t * dst_argb, int width) = ARGBSepiaRow_C;
  uint8_t* dst = dst_argb + dst_y * dst_stride_argb + dst_x * 4;
  if (!dst_argb || width <= 0 || height <= 0 || dst_x < 0 || dst_y < 0) {
    return -1;
  }
  // Coalesce rows.
  if (dst_stride_argb == width * 4) {
    width *= height;
    height = 1;
    dst_stride_argb = 0;
  }
#if defined(HAS_ARGBSEPIAROW_SSSE3)
  if (TestCpuFlag(kCpuHasSSSE3) && IS_ALIGNED(width, 8)) {
    ARGBSepiaRow = ARGBSepiaRow_SSSE3;
  }
#endif
#if defined(HAS_ARGBSEPIAROW_NEON)
  if (TestCpuFlag(kCpuHasNEON) && IS_ALIGNED(width, 8)) {
    ARGBSepiaRow = ARGBSepiaRow_NEON;
  }
#endif
#if defined(HAS_ARGBSEPIAROW_MMI)
  if (TestCpuFlag(kCpuHasMMI) && IS_ALIGNED(width, 2)) {
    ARGBSepiaRow = ARGBSepiaRow_MMI;
  }
#endif
#if defined(HAS_ARGBSEPIAROW_MSA)
  if (TestCpuFlag(kCpuHasMSA) && IS_ALIGNED(width, 8)) {
    ARGBSepiaRow = ARGBSepiaRow_MSA;
  }
#endif

  for (y = 0; y < height; ++y) {
    ARGBSepiaRow(dst, width);
    dst += dst_stride_argb;
  }
  return 0;
}